

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

_Bool mtrap_menu(void)

{
  long lVar1;
  _Bool _Var2;
  short sVar3;
  void *p;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ui_event uVar9;
  menu_iter menu_f;
  menu menu;
  region local_118;
  menu_iter local_108;
  menu_conflict local_e0;
  
  local_108.resize = (_func_void_menu_ptr_conflict *)0x0;
  local_108.display_row = mtrap_display;
  local_108.row_handler = mtrap_action;
  local_108.get_tag = mtrap_tag;
  local_108.valid_row = (_func_int_menu_ptr_int *)0x0;
  local_118.col = L'\x0f';
  local_118.row = L'\x01';
  local_118.width = L'0';
  _Var2 = flag_has_dbg((player->state).pflags,10,0x4d,"player->state.pflags","(PF_EXTRA_TRAP)");
  sVar3 = player->lev / (short)((ushort)!_Var2 * 2 + 4);
  lVar1 = (long)sVar3 + 1;
  p = mem_zalloc(lVar1 * 0x80 + (long)sVar3 * 8 + 8);
  if (z_info->trap_max != 0) {
    lVar4 = 0x68;
    bVar5 = false;
    uVar6 = 0;
    lVar7 = 0;
    do {
      _Var2 = flag_has_dbg(trap_info->flags + lVar4 + -0x68,3,0x10,"trap_info[i].flags","TRF_M_TRAP"
                          );
      lVar8 = lVar7;
      if (_Var2) {
        if (bVar5) {
          lVar8 = lVar7 + 1;
          memcpy((void *)(lVar7 * 0x88 + (long)p),(void *)((long)trap_info + lVar4 + -0x68),0x88);
          goto LAB_001d3130;
        }
        bVar5 = true;
      }
      else {
LAB_001d3130:
        lVar7 = lVar8;
        if (lVar8 == lVar1) break;
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x88;
    } while (uVar6 < z_info->trap_max);
  }
  local_118.page_rows = (wchar_t)(short)(sVar3 + 3);
  if ((short)lVar1 == 0) {
    mem_free(p);
    _Var2 = false;
  }
  else {
    screen_save();
    menu_init(&local_e0,MN_SKIN_SCROLL,&local_108);
    local_e0.title = "Choose an advanced monster trap (ESC to cancel):";
    menu_setpriv(&local_e0,(int)(short)lVar1,p);
    local_e0.browse_hook = mtrap_menu_browser;
    local_e0.flags = 0x10;
    region_erase_bordered(&local_118);
    menu_layout(&local_e0,(region_conflict *)&local_118);
    prt("",local_118.row + L'\x01',local_118.col);
    uVar9 = menu_select(&local_e0,0,true);
    mem_free(p);
    screen_load();
    _Var2 = uVar9.type != EVT_ESCAPE;
  }
  return _Var2;
}

Assistant:

static bool mtrap_menu(void)
{
	struct menu menu;
	menu_iter menu_f = { mtrap_tag, 0, mtrap_display, mtrap_action, 0 };
	region area = { 15, 1, 48, -1 };
	ui_event evt = { 0 };

	size_t i, count = 0, num = 0;

	struct trap_kind *choice;
	bool basic_skipped = false;

	/* See how many traps available */
	if (player_has(player, PF_EXTRA_TRAP)) {
		num = 1 + (player->lev / 4);
	} else {
		num = 1 + (player->lev / 6);
	}

	/* Create the array */
	choice = mem_zalloc(num * sizeof(struct trap_kind));

	/* Pick out the monster traps in order */
	for (i = 0; i < z_info->trap_max; i++) {
		if (trf_has(trap_info[i].flags, TRF_M_TRAP)) {
			if (!basic_skipped) {
				basic_skipped = true;
				continue;
			}
			memcpy(&choice[count++], &trap_info[i], sizeof(struct trap_kind));
		}
		if (count == num) break; 
	}

	/* Clear space */
	area.page_rows = num + 2;

	/* Return here if there are no traps */
	if (!num) {
		mem_free(choice);
		return false;
	}


	/* Save the screen and clear it */
	screen_save();

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu.title = "Choose an advanced monster trap (ESC to cancel):";
	menu_setpriv(&menu, num, choice);
	menu.browse_hook = mtrap_menu_browser;
	menu.flags = MN_DBL_TAP;
	region_erase_bordered(&area);
	menu_layout(&menu, &area);
	prt("", area.row + 1, area.col);

	/* Select an entry */
	evt = menu_select(&menu, 0, true);

	/* Free memory */
	mem_free(choice);

	/* Load screen */
	screen_load();
	return (evt.type != EVT_ESCAPE);
}